

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::ProfiledNewScIntArray<true>
          (InterpreterStackFrame *this,OpLayoutDynamicProfile<Js::OpLayoutAuxiliary> *playout)

{
  ProfileId index;
  uint offset;
  uint32 nValue;
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  FunctionBody *pFVar3;
  AuxArray<int> *ints_00;
  DynamicProfileInfo *this_00;
  ArrayCallSiteInfo *this_01;
  undefined4 *puVar4;
  CacheForCopyOnAccessArraySegments **ppCVar5;
  Recycler *pRVar6;
  RecyclerWeakReference<Js::FunctionBody> *pRVar7;
  JavascriptLibrary *pJVar8;
  SparseArraySegmentBase *pSVar9;
  uint local_a4;
  uint i_1;
  SparseArraySegment<void_*> *segment_2;
  Recycler *recycler_1;
  JavascriptNativeFloatArray *floatArray;
  uint i;
  SparseArraySegment<double> *segment_1;
  Recycler *recycler;
  JavascriptNativeIntArray *intArray;
  SparseArraySegment<int> *segment;
  JavascriptLibrary *lib;
  JavascriptArray *arr;
  ArrayCallSiteInfo *arrayInfo;
  FunctionBody *functionBody;
  ProfileId profileId;
  AuxArray<int> *ints;
  OpLayoutDynamicProfile<Js::OpLayoutAuxiliary> *playout_local;
  InterpreterStackFrame *this_local;
  void *local_10;
  
  offset = (playout->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset;
  pFVar3 = GetFunctionBody(this);
  ints_00 = ByteCodeReader::ReadAuxArray<int>(offset,pFVar3);
  index = playout->profileId;
  pFVar3 = *(FunctionBody **)(this + 0x88);
  this_00 = FunctionBody::GetDynamicProfileInfo(pFVar3);
  this_01 = DynamicProfileInfo::GetArrayCallSiteInfo(this_00,pFVar3,index);
  if (this_01 == (ArrayCallSiteInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1526,"(arrayInfo)","arrayInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this_01 == (ArrayCallSiteInfo *)0x0) ||
     (bVar2 = ArrayCallSiteInfo::IsNativeIntArray(this_01), !bVar2)) {
    if ((this_01 == (ArrayCallSiteInfo *)0x0) ||
       (bVar2 = ArrayCallSiteInfo::IsNativeFloatArray(this_01), !bVar2)) {
      pJVar8 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
      lib = (JavascriptLibrary *)JavascriptLibrary::CreateArrayLiteral(pJVar8,ints_00->count);
      pSVar9 = Js::JavascriptArray::GetHead((JavascriptArray *)lib);
      for (local_a4 = 0; local_a4 < ints_00->count; local_a4 = local_a4 + 1) {
        nValue = ints_00[(ulong)local_a4 + 1].count;
        scriptContext = *(ScriptContext **)(this + 0x78);
        bVar2 = TaggedInt::IsOverflow(nValue);
        if (bVar2) {
          local_10 = JavascriptNumber::NewInlined((double)(int)nValue,scriptContext);
        }
        else {
          local_10 = TaggedInt::ToVarUnchecked(nValue);
        }
        Memory::WriteBarrierPtr<void>::operator=
                  ((WriteBarrierPtr<void> *)(&pSVar9[1].left + (ulong)local_a4 * 2),local_10);
      }
    }
    else {
      pJVar8 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
      lib = (JavascriptLibrary *)
            JavascriptLibrary::CreateNativeFloatArrayLiteral(pJVar8,ints_00->count);
      pSVar9 = Js::JavascriptArray::GetHead((JavascriptArray *)lib);
      for (floatArray._4_4_ = 0; floatArray._4_4_ < ints_00->count;
          floatArray._4_4_ = floatArray._4_4_ + 1) {
        *(double *)(&pSVar9[1].left + (ulong)floatArray._4_4_ * 2) =
             (double)(int)ints_00[(ulong)floatArray._4_4_ + 1].count;
      }
      pRVar6 = ScriptContext::GetRecycler(*(ScriptContext **)(this + 0x78));
      pRVar7 = Memory::Recycler::CreateWeakReferenceHandle<Js::FunctionBody>(pRVar6,pFVar3);
      JavascriptNativeArray::SetArrayCallSite((JavascriptNativeArray *)lib,index,pRVar7);
    }
  }
  else {
    pJVar8 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
    bVar2 = JavascriptLibrary::IsCopyOnAccessArrayCallSite(pJVar8,this_01,ints_00->count);
    if (bVar2) {
      ppCVar5 = Memory::WriteBarrierPtr::operator_cast_to_CacheForCopyOnAccessArraySegments__
                          ((WriteBarrierPtr *)&pJVar8->cacheForCopyOnAccessArraySegments);
      if (*ppCVar5 == (CacheForCopyOnAccessArraySegments *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1530,"(lib->cacheForCopyOnAccessArraySegments)",
                                    "lib->cacheForCopyOnAccessArraySegments");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pJVar8 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
      lib = (JavascriptLibrary *)
            JavascriptLibrary::CreateCopyOnAccessNativeIntArrayLiteral
                      (pJVar8,this_01,pFVar3,ints_00);
    }
    else {
      pJVar8 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
      lib = (JavascriptLibrary *)
            JavascriptLibrary::CreateNativeIntArrayLiteral(pJVar8,ints_00->count);
      pSVar9 = Js::JavascriptArray::GetHead((JavascriptArray *)lib);
      Js::JavascriptOperators::AddIntsToArraySegment((SparseArraySegment<int> *)pSVar9,ints_00);
    }
    pRVar6 = ScriptContext::GetRecycler(*(ScriptContext **)(this + 0x78));
    pRVar7 = Memory::Recycler::CreateWeakReferenceHandle<Js::FunctionBody>(pRVar6,pFVar3);
    JavascriptNativeArray::SetArrayCallSite((JavascriptNativeArray *)lib,index,pRVar7);
  }
  Js::JavascriptArray::CheckForceES5Array((JavascriptArray *)lib);
  SetReg<unsigned_int>(this,(playout->super_OpLayoutAuxiliary).R0,lib);
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledNewScIntArray(const unaligned OpLayoutDynamicProfile<OpLayoutAuxiliary> * playout)
    {
        if (!Profiled && !isAutoProfiling)
        {
            OP_NewScIntArray(playout);
            return;
        }

        const Js::AuxArray<int32> *ints = Js::ByteCodeReader::ReadAuxArray<int32>(playout->Offset, this->GetFunctionBody());

        Js::ProfileId profileId = playout->profileId;
        FunctionBody *functionBody = this->m_functionBody;
        ArrayCallSiteInfo *arrayInfo = functionBody->GetDynamicProfileInfo()->GetArrayCallSiteInfo(functionBody, profileId);
        Assert(arrayInfo);

        JavascriptArray *arr;
        if (arrayInfo && arrayInfo->IsNativeIntArray())
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary *lib = scriptContext->GetLibrary();

            if (JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib, arrayInfo, ints->count))
            {
                Assert(lib->cacheForCopyOnAccessArraySegments);
                arr = scriptContext->GetLibrary()->CreateCopyOnAccessNativeIntArrayLiteral(arrayInfo, functionBody, ints);
            }
            else
#endif
            {
                arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(ints->count);
                SparseArraySegment<int32> *segment = (SparseArraySegment<int32>*)arr->GetHead();
                JavascriptOperators::AddIntsToArraySegment(segment, ints);
            }

            JavascriptNativeIntArray *intArray = reinterpret_cast<JavascriptNativeIntArray*>(arr);
            Recycler *recycler = scriptContext->GetRecycler();
            intArray->SetArrayCallSite(profileId, recycler->CreateWeakReferenceHandle(functionBody));
        }
        else if (arrayInfo && arrayInfo->IsNativeFloatArray())
        {
            arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(ints->count);
            SparseArraySegment<double> * segment = (SparseArraySegment<double>*)arr->GetHead();
            for (uint i = 0; i < ints->count; i++)
            {
                segment->elements[i] = (double)ints->elements[i];
            }

            JavascriptNativeFloatArray *floatArray = reinterpret_cast<JavascriptNativeFloatArray*>(arr);
            Recycler *recycler = scriptContext->GetRecycler();
            floatArray->SetArrayCallSite(profileId, recycler->CreateWeakReferenceHandle(functionBody));
        }
        else
        {
            arr = scriptContext->GetLibrary()->CreateArrayLiteral(ints->count);
            SparseArraySegment<Var> * segment = (SparseArraySegment<Var>*)arr->GetHead();
            for (uint i = 0; i < ints->count; i++)
            {
                segment->elements[i] = JavascriptNumber::ToVar(ints->elements[i], scriptContext);
            }
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }